

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderBlitting.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderBlittingLayeredToNonLayered::setUpFramebuffersForRendering
          (GeometryShaderBlittingLayeredToNonLayered *this,GLuint fbo_draw_id,GLuint fbo_read_id,
          GLint to_draw,GLint to_read)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLint to_read_local;
  GLint to_draw_local;
  GLuint fbo_read_id_local;
  GLuint fbo_draw_id_local;
  GeometryShaderBlittingLayeredToNonLayered *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderBlitting).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(0x8ca8,fbo_read_id);
  (**(code **)(lVar3 + 0x78))(0x8ca9,fbo_draw_id);
  (**(code **)(lVar3 + 0x690))(0x8ca8,0x8ce0,to_read,0);
  (**(code **)(lVar3 + 0x6b8))(0x8ca9,0x8ce0,to_draw,0);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Error setting up FBOs setUpFramebuffersForRendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,0x123);
  return;
}

Assistant:

void GeometryShaderBlittingLayeredToNonLayered::setUpFramebuffersForRendering(glw::GLuint fbo_draw_id,
																			  glw::GLuint fbo_read_id,
																			  glw::GLint to_draw, glw::GLint to_read)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind framebuffers */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, fbo_read_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_draw_id);

	/* Blitting from a layered read framebuffer to a non-layered draw framebuffer*/
	gl.framebufferTexture(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_read, 0 /* level */);
	gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_draw, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up FBOs setUpFramebuffersForRendering");
}